

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

world_ptr __thiscall
APhyBullet::BulletEngine::createDynamicsWorld
          (BulletEngine *this,collision_dispatcher_ref *collision_dispatcher,
          broadphase_ref *broadphase,constraint_solver_ref *constraint_solver,
          collision_configuration_ref *collision_configuration)

{
  bool bVar1;
  BulletConstraintSolver *pBVar2;
  BulletWorld *other;
  ref *in_RCX;
  ref<aphy::broadphase> *in_RDX;
  ref *in_RSI;
  btCollisionConfiguration *in_RDI;
  ref *in_R8;
  btBroadphaseInterface *unaff_retaddr;
  btDispatcher *in_stack_00000008;
  btDiscreteDynamicsWorld *in_stack_00000010;
  BulletWorld *world;
  ref<aphy::world> result;
  btDiscreteDynamicsWorld *in_stack_ffffffffffffff58;
  ref<aphy::world> *this_00;
  btConstraintSolver *this_01;
  ref<aphy::world> local_38;
  ref *local_30;
  ref *local_28;
  ref<aphy::broadphase> *local_20;
  ref *local_18;
  btConstraintSolver *in_stack_fffffffffffffff8;
  Counter *pCVar3;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = aphy::ref::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    bVar1 = aphy::ref::operator_cast_to_bool(local_28);
    if (bVar1) {
      bVar1 = aphy::ref::operator_cast_to_bool(local_30);
      if (bVar1) {
        btDiscreteDynamicsWorld::operator_new(0x127a29);
        aphy::ref<aphy::collision_dispatcher>::as<APhyBullet::BulletCollisionDispatcher>
                  ((ref<aphy::collision_dispatcher> *)local_18);
        aphy::ref<aphy::broadphase>::as<APhyBullet::BulletBroadphase>(local_20);
        pBVar2 = aphy::ref<aphy::constraint_solver>::as<APhyBullet::BulletConstraintSolver>
                           ((ref<aphy::constraint_solver> *)local_28);
        this_01 = pBVar2->handle;
        aphy::ref<aphy::collision_configuration>::as<APhyBullet::BulletCollisionConfiguration>
                  ((ref<aphy::collision_configuration> *)local_30);
        btDiscreteDynamicsWorld::btDiscreteDynamicsWorld
                  (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
                   in_RDI);
        this_00 = &local_38;
        aphy::makeObject<APhyBullet::BulletWorld,btDiscreteDynamicsWorld*>
                  (in_stack_ffffffffffffff58);
        other = aphy::ref<aphy::world>::as<APhyBullet::BulletWorld>(this_00);
        aphy::ref<aphy::collision_dispatcher>::operator=
                  ((ref<aphy::collision_dispatcher> *)this_01,(StrongRef *)other);
        aphy::ref<aphy::broadphase>::operator=((ref<aphy::broadphase> *)this_01,(StrongRef *)other);
        aphy::ref<aphy::constraint_solver>::operator=
                  ((ref<aphy::constraint_solver> *)this_01,(StrongRef *)other);
        aphy::ref<aphy::collision_configuration>::operator=
                  ((ref<aphy::collision_configuration> *)this_01,(StrongRef *)other);
        pCVar3 = aphy::ref<aphy::world>::disown(&local_38);
        aphy::ref<aphy::world>::~ref(this_00);
      }
      else {
        pCVar3 = (Counter *)0x0;
      }
    }
    else {
      pCVar3 = (Counter *)0x0;
    }
  }
  else {
    pCVar3 = (Counter *)0x0;
  }
  return pCVar3;
}

Assistant:

world_ptr BulletEngine::createDynamicsWorld(const collision_dispatcher_ref &collision_dispatcher, const broadphase_ref &broadphase, const constraint_solver_ref &constraint_solver, const collision_configuration_ref &collision_configuration)
{
    if(!collision_dispatcher)
        return nullptr;
    if(!constraint_solver)
        return nullptr;
    if(!collision_configuration)
        return nullptr;

    auto result = makeObject<BulletWorld> (
        new btDiscreteDynamicsWorld(collision_dispatcher.as<BulletCollisionDispatcher>()->handle,
            broadphase.as<BulletBroadphase>()->handle,
            constraint_solver.as<BulletConstraintSolver>()->handle,
            collision_configuration.as<BulletCollisionConfiguration>()->handle));

    auto world = result.as<BulletWorld> ();
    world->collisionDispatcher = collision_dispatcher;
    world->broadphase = broadphase;
    world->constraintSolver = constraint_solver;
    world->collisionConfiguration = collision_configuration;
    return result.disown();
}